

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix_func.c
# Opt level: O0

void xc_mix_init(xc_func_type *p,int n_funcs,int *funcs_id,double *mix_coef)

{
  void *pvVar1;
  long in_RCX;
  int in_ESI;
  long in_RDI;
  int unaff_retaddr;
  int ii;
  undefined4 local_24;
  
  *(int *)(in_RDI + 0xc) = in_ESI;
  pvVar1 = malloc((long)in_ESI << 3);
  *(void **)(in_RDI + 0x18) = pvVar1;
  pvVar1 = malloc((long)in_ESI << 3);
  *(void **)(in_RDI + 0x10) = pvVar1;
  for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
    *(undefined8 *)(*(long *)(in_RDI + 0x18) + (long)local_24 * 8) =
         *(undefined8 *)(in_RCX + (long)local_24 * 8);
    pvVar1 = malloc(0x1a0);
    *(void **)(*(long *)(in_RDI + 0x10) + (long)local_24 * 8) = pvVar1;
    xc_func_init((xc_func_type *)mix_coef,ii,unaff_retaddr);
  }
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  return;
}

Assistant:

void
xc_mix_init(xc_func_type *p, int n_funcs, const int *funcs_id, const double *mix_coef)
{
  int ii;

  assert(p != NULL);
  assert(p->func_aux == NULL && p->mix_coef == NULL);

  /* allocate structures needed for mixed functional */
  p->n_func_aux = n_funcs;
  p->mix_coef   = (double *) libxc_malloc(n_funcs*sizeof(double));
  p->func_aux   = (xc_func_type **) libxc_malloc(n_funcs*sizeof(xc_func_type *));

  for(ii=0; ii<n_funcs; ii++){
    p->mix_coef[ii] = mix_coef[ii];
    p->func_aux[ii] = (xc_func_type *) libxc_malloc(sizeof(xc_func_type));
    xc_func_init (p->func_aux[ii], funcs_id[ii], p->nspin);
  }

  /* initialize variables */
  p->cam_alpha = 0.0;
  p->cam_beta  = 0.0;
  p->cam_omega = 0.0;
  p->nlc_b     = 0.0;
  p->nlc_C     = 0.0;
}